

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebugStateSaver::~QDebugStateSaver(QDebugStateSaver *this)

{
  QDebugStateSaverPrivate::restoreState
            ((this->d)._M_t.
             super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>
             .super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl);
  std::unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>::
  ~unique_ptr(&this->d);
  return;
}

Assistant:

QDebugStateSaver::~QDebugStateSaver()
{
    d->restoreState();
}